

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

uint __thiscall
crnlib::command_line_params::find
          (command_line_params *this,uint num_keys,char **ppKeys,
          vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
          *pIterators,vector<unsigned_int> *pUnmatched_indices)

{
  char *pKey_00;
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  pointer ppVar4;
  int k;
  param_map_const_iterator end;
  param_map_const_iterator begin;
  char *pKey;
  uint local_38;
  uint i_1;
  uint n;
  uint i;
  vector<unsigned_int> *pUnmatched_indices_local;
  vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  *pIterators_local;
  char **ppKeys_local;
  uint num_keys_local;
  command_line_params *this_local;
  
  if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
    uVar2 = vector<crnlib::dynamic_string>::size(&this->m_params);
    vector<unsigned_int>::resize(pUnmatched_indices,uVar2,false);
    for (i_1 = 0; uVar2 = vector<crnlib::dynamic_string>::size(&this->m_params), i_1 < uVar2;
        i_1 = i_1 + 1) {
      puVar3 = vector<unsigned_int>::operator[](pUnmatched_indices,i_1);
      *puVar3 = i_1;
    }
  }
  local_38 = 0;
  for (pKey._4_4_ = 0; pKey._4_4_ < num_keys; pKey._4_4_ = pKey._4_4_ + 1) {
    pKey_00 = ppKeys[pKey._4_4_];
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator(&end);
    std::
    _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                *)&stack0xffffffffffffffa8);
    find(this,pKey_00,&end,(param_map_const_iterator *)&stack0xffffffffffffffa8);
    while (bVar1 = std::operator!=(&end,(_Self *)&stack0xffffffffffffffa8), bVar1) {
      if (pIterators !=
          (vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
           *)0x0) {
        vector<std::_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
        ::push_back(pIterators,&end);
      }
      if (pUnmatched_indices != (vector<unsigned_int> *)0x0) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                 ::operator->(&end);
        uVar2 = vector<unsigned_int>::find(pUnmatched_indices,&(ppVar4->second).m_index);
        if (-1 < (int)uVar2) {
          vector<unsigned_int>::erase_unordered(pUnmatched_indices,uVar2);
        }
      }
      local_38 = local_38 + 1;
      std::
      _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
      ::operator++(&end,0);
    }
  }
  return local_38;
}

Assistant:

uint command_line_params::find(uint num_keys, const char** ppKeys, crnlib::vector<param_map_const_iterator>* pIterators, crnlib::vector<uint>* pUnmatched_indices) const
    {
        CRNLIB_ASSERT(ppKeys);

        if (pUnmatched_indices)
        {
            pUnmatched_indices->resize(m_params.size());
            for (uint i = 0; i < m_params.size(); i++)
            {
                (*pUnmatched_indices)[i] = i;
            }
        }

        uint n = 0;
        for (uint i = 0; i < num_keys; i++)
        {
            const char* pKey = ppKeys[i];

            param_map_const_iterator begin, end;
            find(pKey, begin, end);

            while (begin != end)
            {
                if (pIterators)
                {
                    pIterators->push_back(begin);
                }

                if (pUnmatched_indices)
                {
                    int k = pUnmatched_indices->find(begin->second.m_index);
                    if (k >= 0)
                    {
                        pUnmatched_indices->erase_unordered(k);
                    }
                }

                n++;
                begin++;
            }
        }

        return n;
    }